

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

void __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::rescale(raw_quasi_adaptive_huffman_data_model *this)

{
  uint uVar1;
  unsigned_short *puVar2;
  uint i;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = this->m_total_syms;
  puVar2 = (this->m_sym_freq).m_p;
  uVar4 = 0;
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    uVar5 = puVar2[uVar3] + 1 >> 1;
    uVar4 = uVar4 + uVar5;
    puVar2[uVar3] = (unsigned_short)uVar5;
  }
  this->m_total_count = uVar4;
  return;
}

Assistant:

void raw_quasi_adaptive_huffman_data_model::rescale()
   {
      uint total_freq = 0;

      for (uint i = 0; i < m_total_syms; i++)
      {
         uint freq = (m_sym_freq[i] + 1) >> 1;
         total_freq += freq;
         m_sym_freq[i] = static_cast<uint16>(freq);
      }

      m_total_count = total_freq;
   }